

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hmac.c
# Opt level: O2

void cf_hmac(uint8_t *key,size_t nkey,uint8_t *msg,size_t nmsg,uint8_t *out,cf_chash *hash)

{
  cf_hmac_ctx ctx;
  cf_hmac_ctx cStack_2f8;
  
  if ((out != (uint8_t *)0x0) && (hash != (cf_chash *)0x0)) {
    cf_hmac_init(&cStack_2f8,hash,key,nkey);
    cf_hmac_update(&cStack_2f8,msg,nmsg);
    cf_hmac_finish(&cStack_2f8,out);
    return;
  }
  abort();
}

Assistant:

void cf_hmac(const uint8_t *key, size_t nkey,
             const uint8_t *msg, size_t nmsg,
             uint8_t *out,
             const cf_chash *hash)
{
  cf_hmac_ctx ctx;
  
  assert(out);
  assert(hash);

  cf_hmac_init(&ctx, hash, key, nkey);
  cf_hmac_update(&ctx, msg, nmsg);
  cf_hmac_finish(&ctx, out);
}